

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::Optimize(Inline *this,Func *func,Instr **callerArgOuts,ArgSlot callerArgOutCount,
                uint recursiveInlineDepth)

{
  undefined1 *puVar1;
  byte bVar2;
  Type TVar3;
  InlineCacheIndex inlineCacheIndex;
  TSize TVar4;
  Opnd *pOVar5;
  Func *pFVar6;
  code *pcVar7;
  uint16 constantArguments;
  bool bVar8;
  bool bVar9;
  bool isConstructorCall;
  bool isBuiltIn;
  bool bVar10;
  ProfileId PVar11;
  ProfileId PVar12;
  ValueType VVar13;
  ArgSlot AVar14;
  uint uVar15;
  uint uVar16;
  PragmaInstr *pPVar17;
  SymOpnd *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar18;
  ProfiledInstr *pPVar19;
  FunctionJITTimeInfo *pFVar20;
  LabelInstr *pLVar21;
  char16_t *this_01;
  Instr *pIVar22;
  RegOpnd *pRVar23;
  BranchInstr *pBVar24;
  LabelInstr *pLVar25;
  PropertySymOpnd *pPVar26;
  StackSym *pSVar27;
  ByteCodeUsesInstr *this_02;
  JITTimeFunctionBody *pJVar28;
  char16 *pcVar29;
  char16 *pcVar30;
  intptr_t iVar31;
  intptr_t iVar32;
  SymOpnd *pSVar33;
  uint uVar34;
  undefined4 *puVar35;
  Instr *pIVar36;
  Instr *pIVar37;
  undefined **ppuVar38;
  char *this_03;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar39;
  char16_t *pcVar40;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_04;
  char16_t *pcVar41;
  Phase phase;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_148 [4];
  char16 debugStringBuffer [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_e8;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_e0;
  Type local_bc;
  uint local_ac;
  StackSym *local_a8;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_98;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_8a;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_88;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_80;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_78;
  byte local_69;
  undefined4 *local_68;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  LabelInstr *pLStack_58;
  ValueType builtInReturnType;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_48;
  bool local_31 [8];
  bool isInlined;
  
  local_78 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)func;
  bVar8 = Func::DoGlobOpt(func);
  if (!bVar8) {
    return;
  }
  bVar8 = Func::DoGlobOpt(this->topFunc);
  paVar39 = local_78;
  if (!bVar8) {
    return;
  }
  unique0x100027f0 = callerArgOuts;
  uVar15 = Func::GetSourceContextId((Func *)&local_78->field_0);
  uVar16 = Func::GetLocalFunctionId((Func *)&paVar39->field_0);
  local_69 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FixedMethodsPhase,uVar15,uVar16);
  local_80 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
             JITTimeWorkItem::GetJITTimeInfo(*(JITTimeWorkItem **)(paVar39 + 0x10));
  uVar15 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)&local_80->field_0);
  bVar8 = true;
  if (uVar15 == 0) {
    bVar8 = FunctionJITTimeInfo::IsLdFldInlineePresent((FunctionJITTimeInfo *)&local_80->field_0);
  }
  uVar15 = Func::GetSourceContextId(this->topFunc);
  uVar16 = Func::GetLocalFunctionId(this->topFunc);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar15,uVar16);
  paVar39 = local_78;
  if (!bVar9) {
    uVar15 = Func::GetSourceContextId((Func *)&local_78->field_0);
    uVar16 = Func::GetLocalFunctionId((Func *)&paVar39->field_0);
    bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar15,uVar16);
    if ((!bVar9) && (bVar9 = Func::IsJitInDebugMode((Func *)&local_78->field_0), !bVar9))
    goto LAB_004fc21c;
  }
  bVar8 = false;
LAB_004fc21c:
  local_78[0xf2].bits = callerArgOutCount;
  this->currentForInDepth = *(uint *)(local_78 + 0xe2);
  this->lastStatementBoundary = (PragmaInstr *)0x0;
  local_48 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(local_78 + 100);
  ppuVar38 = &PTR_013e5f18;
  local_68 = (undefined4 *)__tls_get_addr();
  local_69 = local_69 ^ 1;
  local_e0 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)&DAT_014594b0;
  local_e8 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)&DAT_01453738;
  local_88 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)&DAT_01441eb0;
  local_bc = 0;
  local_a8 = (StackSym *)0x0;
  pLVar21 = (LabelInstr *)0x0;
  this_03 = (char *)(anon_union_2_4_ea848c7b_for_ValueType_13 *)ppuVar38;
LAB_004fc2be:
  do {
    paVar39 = local_48;
    if (paVar39 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
      uVar15 = Func::GetSourceContextId(this->topFunc);
      uVar16 = Func::GetLocalFunctionId(this->topFunc);
      bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,InlinePhase,uVar15,uVar16);
      if ((bVar8) || (bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase), bVar8)) {
        Output::Flush();
      }
      return;
    }
    local_48 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(paVar39 + 8);
    local_31[0] = false;
    if (bVar8 == false) goto LAB_004fccdb;
    TVar3 = paVar39[0x18].bits;
    bVar9 = false;
    if (TVar3 == (Object|CanBeTaggedValue|Null|Undefined|Likely)) {
      isConstructorCall = false;
      pLStack_58 = pLVar21;
LAB_004fc8da:
      pPVar26 = GetMethodLdOpndForCallInstr((Inline *)this_03,(Instr *)&paVar39->field_0);
      uVar15 = this->inlineesProcessed;
      this_01 = (char16_t *)local_80;
      uVar16 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)&local_80->field_0);
      if ((uVar15 == uVar16) || (*(char *)((long)paVar39 + 0x39) != '\x04')) {
LAB_004fcfc9:
        TryResetObjTypeSpecFldInfoOn((Inline *)this_01,pPVar26);
        TryDisableRuntimePolymorphicCacheOn((Inline *)this_01,pPVar26);
LAB_004fcfdb:
        bVar9 = false;
      }
      else {
        pPVar19 = IR::Instr::AsProfiledInstr((Instr *)&paVar39->field_0);
        TVar4 = (pPVar19->u).field_3.fldInfoData;
        uVar34 = (uint)TVar4 & 0xffff;
        this_01 = (char16_t *)Func::GetJITFunctionBody((Func *)&local_78->field_0);
        PVar11 = JITTimeFunctionBody::GetProfiledCallSiteCount((JITTimeFunctionBody *)this_01);
        pcVar40 = (char16_t *)local_80;
        if (PVar11 <= uVar34) goto LAB_004fcfc9;
        PVar11 = TVar4.f1;
        local_98 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                   FunctionJITTimeInfo::GetInlinee((FunctionJITTimeInfo *)&local_80->field_0,PVar11)
        ;
        if (local_98 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
          this_01 = (char16_t *)local_78;
          bVar9 = Js::PhaseIsEnabled::InlineCallbacksPhase<Func*>((Func *)&local_78->field_0);
          if ((!bVar9) ||
             (this_01 = (char16_t *)this,
             pIVar22 = TryGetCallbackDefInstrForCallInstr(this,(Instr *)&paVar39->field_0),
             pIVar22 == (Instr *)0x0)) goto LAB_004fcfc9;
LAB_004fcedf:
          pPVar19 = IR::Instr::AsProfiledInstr(pIVar22);
          PVar12 = (pPVar19->u).field_3.fldInfoData.f1;
          pFVar20 = JITTimeWorkItem::GetJITTimeInfo(pIVar22->m_func->m_workItem);
          local_98 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     FunctionJITTimeInfo::GetCallbackInlinee(pFVar20,PVar12);
          uVar15 = Func::GetSourceContextId(this->topFunc);
          uVar16 = Func::GetLocalFunctionId(this->topFunc);
          bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlineCallbacksPhase,uVar15,uVar16);
          if (!bVar9) {
            uVar15 = Func::GetSourceContextId(this->topFunc);
            uVar16 = Func::GetLocalFunctionId(this->topFunc);
            pcVar40 = (char16_t *)local_e8;
            bVar9 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_01453738,InlineCallbacksPhase,uVar15,uVar16);
            if (!bVar9) goto LAB_004fcfea;
          }
          paVar18 = local_80;
          pJVar28 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)&local_80->field_0);
          pcVar29 = JITTimeFunctionBody::GetDisplayName(pJVar28);
          pcVar30 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)&paVar18->field_0,(wchar (*) [42])local_148);
          pcVar40 = L"INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n";
          Output::Print(L"INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n",
                        (ulong)PVar12,pcVar29,pcVar30);
          Output::Flush();
LAB_004fcfea:
          TryResetObjTypeSpecFldInfoOn((Inline *)pcVar40,pPVar26);
          TryDisableRuntimePolymorphicCacheOn((Inline *)pcVar40,pPVar26);
          ValueType::ValueType((ValueType *)&local_5a.field_0);
          if (isConstructorCall == false) {
LAB_004fd054:
            isBuiltIn = InliningDecider::GetBuiltInInfo
                                  ((FunctionJITTimeInfo *)&local_98->field_0,&local_148[0].bits,
                                   (ValueType *)&local_5a.field_0);
            bVar9 = ValueType::IsUninitialized((ValueType *)&local_5a.field_0);
            if ((!bVar9) && (*(long *)(paVar39 + 0x20) != 0)) {
              bVar9 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)&local_98->field_0);
              if (bVar9) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar35 = local_68;
                *local_68 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x12a,"(!inlineeData->HasBody())","!inlineeData->HasBody()");
                if (!bVar9) goto LAB_004fde7d;
                *puVar35 = 0;
              }
              if (paVar39[0x18].bits == (IntIsLikelyUntagged|IntCanBeUntagged|Null|Undefined|Likely)
                 ) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar35 = local_68;
                *local_68 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,299,"(instr->m_opcode != Js::OpCode::NewScObjArray)",
                                   "We should have broken out of the switch statement earlier on this opcode."
                                  );
                if (!bVar9) goto LAB_004fde7d;
                *puVar35 = 0;
                if (paVar39[0x18].bits ==
                    (IntIsLikelyUntagged|IntCanBeUntagged|Null|Undefined|Likely)) {
                  local_8a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                              (*(long *)(paVar39 + 0x20) + 8);
                  bVar9 = ValueType::IsLikelyNativeArray((ValueType *)&local_8a.field_0);
                  if (bVar9) goto LAB_004fd172;
                }
              }
              pOVar5 = *(Opnd **)(paVar39 + 0x20);
              VVar13 = ValueType::ToLikely((ValueType *)&local_5a.field_0);
              IR::Opnd::SetValueType(pOVar5,VVar13);
            }
LAB_004fd172:
            bVar9 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)&local_98->field_0);
            if (bVar9) {
              uVar15 = FunctionJITTimeInfo::GetSourceContextId
                                 ((FunctionJITTimeInfo *)&local_98->field_0);
              uVar16 = FunctionJITTimeInfo::GetLocalFunctionId
                                 ((FunctionJITTimeInfo *)&local_98->field_0);
              this_03 = (char *)local_88;
              bVar9 = Js::Phases::IsEnabled
                                ((Phases *)&local_88->field_0,InlineCandidatePhase,uVar15,uVar16);
            }
            else {
              this_03 = (char *)local_88;
              bVar9 = Js::Phases::IsEnabled((Phases *)&local_88->field_0,InlineBuiltInPhase);
            }
            pLVar21 = pLStack_58;
            if ((bVar9 == false) &&
               ((this_03 = (char *)local_98,
                bVar9 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)&local_98->field_0),
                bVar9 || (local_148[0].bits != 0)))) {
              this_03 = (char *)local_98;
              bVar9 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)&local_98->field_0);
              if (bVar9) {
                this_03 = (char *)FunctionJITTimeInfo::GetBody
                                            ((FunctionJITTimeInfo *)&local_98->field_0);
                bVar9 = JITTimeFunctionBody::HasProfileInfo((JITTimeFunctionBody *)this_03);
                paVar18 = local_78;
                if (bVar9) {
                  pLStack_58 = pLVar21;
                  uVar15 = Func::GetSourceContextId((Func *)&local_78->field_0);
                  uVar16 = Func::GetLocalFunctionId((Func *)&paVar18->field_0);
                  bVar9 = Js::Phases::IsEnabled
                                    ((Phases *)&local_88->field_0,InlineRecursivePhase,uVar15,uVar16
                                    );
                  if (bVar9) {
                    local_ac._0_2_ = 0;
                  }
                  else {
                    pSVar27 = IR::Opnd::GetStackSym(*(Opnd **)(paVar39 + 0x28));
                    pIVar36 = (pSVar27->field_5).m_instrDef;
                    if ((pSVar27->field_0x18 & pIVar36 != (Instr *)0x0) == 0) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar35 = local_68;
                      *local_68 = 1;
                      bVar9 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                         ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()")
                      ;
                      if (!bVar9) goto LAB_004fde7d;
                      *puVar35 = 0;
                      pIVar36 = (pSVar27->field_5).m_instrDef;
                    }
                    local_ac = 0;
                    puVar35 = local_68;
                    do {
                      if ((pIVar36->m_src2 == (Opnd *)0x0) ||
                         (bVar9 = IR::Opnd::IsSymOpnd(pIVar36->m_src2), !bVar9)) {
LAB_004fda76:
                        pIVar37 = (Instr *)0x0;
                      }
                      else {
                        pSVar33 = IR::Opnd::AsSymOpnd(pIVar36->m_src2);
                        pSVar27 = Sym::AsStackSym(pSVar33->m_sym);
                        bVar9 = StackSym::IsArgSlotSym(pSVar27);
                        if (!bVar9) {
                          AssertCount = AssertCount + 1;
                          Js::Throw::LogAssert();
                          *puVar35 = 1;
                          bVar9 = Js::Throw::ReportAssert
                                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                             ,0x1b8,"(linkSym->IsArgSlotSym())",
                                             "linkSym->IsArgSlotSym()");
                          if (!bVar9) goto LAB_004fde7d;
                          *puVar35 = 0;
                        }
                        if (((((pSVar27->field_0x18 & 1) == 0) ||
                             ((pSVar27->field_5).m_instrDef == (Instr *)0x0)) &&
                            (bVar9 = Func::IsInPhase(*(Func **)(paVar39 + 0x10),FGPeepsPhase),
                            !bVar9)) &&
                           (bVar9 = Func::IsInPhase(*(Func **)(paVar39 + 0x10),FGBuildPhase), !bVar9
                           )) {
                          AssertCount = AssertCount + 1;
                          Js::Throw::LogAssert();
                          *puVar35 = 1;
                          bVar9 = Js::Throw::ReportAssert
                                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                             ,0x1bf,
                                             "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                                             ,
                                             "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                                            );
                          if (!bVar9) goto LAB_004fde7d;
                          *puVar35 = 0;
                        }
                        if ((pSVar27->field_0x18 & 1) == 0) goto LAB_004fda76;
                        pIVar37 = (pSVar27->field_5).m_instrDef;
                      }
                      if (pIVar36->m_opcode != ArgOut_A_InlineSpecialized) {
                        if (pIVar36->m_opcode == StartCall) {
                          if (pIVar37 != (Instr *)0x0) {
                            AssertCount = AssertCount + 1;
                            Js::Throw::LogAssert();
                            *puVar35 = 1;
                            bVar9 = Js::Throw::ReportAssert
                                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                               ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
                            if (!bVar9) goto LAB_004fde7d;
                            *puVar35 = 0;
                          }
                          break;
                        }
                        pOVar5 = pIVar36->m_src1;
                        bVar9 = IR::Opnd::IsRegOpnd(pOVar5);
                        puVar35 = local_68;
                        if (bVar9) {
                          pRVar23 = IR::Opnd::AsRegOpnd(pOVar5);
                          bVar9 = StackSym::IsIntConst(pRVar23->m_sym);
                          puVar35 = local_68;
                          if (((bVar9) && (pIVar36->m_src2 != (Opnd *)0x0)) &&
                             (bVar9 = IR::Opnd::IsSymOpnd(pIVar36->m_src2), bVar9)) {
                            pSVar33 = IR::Opnd::AsSymOpnd(pIVar36->m_dst);
                            pSVar27 = Sym::AsStackSym(pSVar33->m_sym);
                            if (((pSVar27->field_0x18 & 1) == 0) ||
                               ((pSVar27->field_5).m_instrDef == (Instr *)0x0)) {
                              AssertCount = AssertCount + 1;
                              Js::Throw::LogAssert();
                              puVar35 = local_68;
                              *local_68 = 1;
                              bVar9 = Js::Throw::ReportAssert
                                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                                 ,0x174,"(dstSym->IsSingleDef())",
                                                 "dstSym->IsSingleDef()");
                              if (!bVar9) goto LAB_004fde7d;
                              *puVar35 = 0;
                            }
                            bVar9 = StackSym::IsArgSlotSym(pSVar27);
                            if (!bVar9) {
                              AssertCount = AssertCount + 1;
                              Js::Throw::LogAssert();
                              puVar35 = local_68;
                              *local_68 = 1;
                              bVar9 = Js::Throw::ReportAssert
                                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                                 ,0x175,"(dstSym->IsArgSlotSym())",
                                                 "dstSym->IsArgSlotSym()");
                              if (!bVar9) goto LAB_004fde7d;
                              *puVar35 = 0;
                            }
                            AVar14 = StackSym::GetArgSlotNum(pSVar27);
                            if ((short)(AVar14 - 1) == 0xd) break;
                            local_ac = local_ac | 1 << (AVar14 - 1 & 0x1f);
                            puVar35 = local_68;
                          }
                        }
                      }
                      pIVar36 = pIVar37;
                    } while (pIVar37 != (Instr *)0x0);
                  }
                  pFVar6 = this->topFunc;
                  this_03 = (char *)this->inliningHeuristics;
                  bVar9 = IsInliningOutSideLoops(this);
                  bVar10 = InliningHeuristics::BackendInlineIntoInliner
                                     ((InliningHeuristics *)this_03,
                                      (FunctionJITTimeInfo *)&local_98->field_0,
                                      (Func *)&local_78->field_0,pFVar6,PVar11,isConstructorCall,
                                      true,bVar9,this->isInLoop != 0,recursiveInlineDepth,
                                      (uint16)local_ac);
                  bVar9 = true;
                  pLVar21 = pLStack_58;
                  if (!bVar10) {
                    bVar9 = false;
                    goto LAB_004fcce0;
                  }
LAB_004fdc2a:
                  if (local_148[0].bits == 0) {
                    local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                               InlineScriptFunction
                                         (this,(Instr *)&paVar39->field_0,
                                          (FunctionJITTimeInfo *)&local_98->field_0,local_a8,PVar11,
                                          local_31,pIVar22,recursiveInlineDepth);
                  }
                  else {
                    local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                               InlineBuiltInFunction
                                         (this,(Instr *)&paVar39->field_0,
                                          (FunctionJITTimeInfo *)&local_98->field_0,
                                          local_148[0].bits,
                                          (FunctionJITTimeInfo *)&local_80->field_0,local_a8,
                                          local_31,uVar34,recursiveInlineDepth,(Instr *)paVar39);
                  }
                  pLStack_58 = pLVar21;
                  if (!bVar9 && local_31[0] == false) {
                    *(byte *)(*(long *)(paVar39 + 0x20) + 0xb) =
                         *(byte *)(*(long *)(paVar39 + 0x20) + 0xb) & 0xfe;
                    pOVar5 = *(Opnd **)(paVar39 + 0x20);
                    local_8a = (pOVar5->m_valueType).field_0;
                    VVar13 = ValueType::ToLikely((ValueType *)&local_8a.field_0);
                    IR::Opnd::SetValueType(pOVar5,VVar13);
                  }
                  bVar9 = false;
                  paVar18 = local_80;
                  goto LAB_004fdd7d;
                }
              }
              else {
                if (local_148[0].bits == 0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar35 = local_68;
                  *local_68 = 1;
                  this_03 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                  ;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x146,"(builtInInlineCandidateOpCode != 0)",
                                     "builtInInlineCandidateOpCode != 0");
                  if (!bVar9) goto LAB_004fde7d;
                  *puVar35 = 0;
                }
                if (isConstructorCall == false) {
                  bVar10 = ValueType::IsUninitialized((ValueType *)&local_5a.field_0);
                  bVar9 = true;
                  if ((!bVar10) && (*(Opnd **)(paVar39 + 0x20) != (Opnd *)0x0)) {
                    IR::Opnd::SetValueType(*(Opnd **)(paVar39 + 0x20),(ValueType)local_5a.field_0);
                    bVar9 = ValueType::IsDefinite((ValueType *)&local_5a.field_0);
                    if (bVar9) {
                      *(byte *)(*(long *)(paVar39 + 0x20) + 0xb) =
                           *(byte *)(*(long *)(paVar39 + 0x20) + 0xb) | 1;
                    }
                    bVar9 = false;
                  }
                  goto LAB_004fdc2a;
                }
              }
            }
          }
          else {
            iVar31 = FunctionJITTimeInfo::GetFunctionInfoAddr
                               ((FunctionJITTimeInfo *)&local_98->field_0);
            iVar32 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                               (this->topFunc->m_threadContextInfo);
            if (iVar31 != iVar32) goto LAB_004fd054;
            paVar39[0x18].bits = IntIsLikelyUntagged|IntCanBeUntagged|Null|Undefined|Likely;
            this_03 = (char *)paVar39;
            pPVar19 = IR::Instr::AsProfiledInstr((Instr *)&paVar39->field_0);
            (pPVar19->u).profileId = 0xffff;
            isBuiltIn = true;
            pLVar21 = pLStack_58;
          }
          goto LAB_004fccdd;
        }
        bVar9 = FunctionJITTimeInfo::IsPolymorphicCallSite((FunctionJITTimeInfo *)pcVar40,PVar11);
        if (!bVar9) {
          pIVar22 = (Instr *)0x0;
          goto LAB_004fcfea;
        }
        bVar9 = Js::PhaseIsEnabled::InlineCallbacksPhase<Func*>((Func *)&local_78->field_0);
        if ((bVar9) &&
           (pIVar22 = TryGetCallbackDefInstrForCallInstr(this,(Instr *)&paVar39->field_0),
           pIVar22 != (Instr *)0x0)) goto LAB_004fcedf;
        if (isConstructorCall == false) {
          uVar15 = Func::GetSourceContextId(this->topFunc);
          uVar16 = Func::GetLocalFunctionId(this->topFunc);
          bVar9 = Js::Phases::IsEnabled
                            ((Phases *)&local_88->field_0,PolymorphicInlinePhase,uVar15,uVar16);
          paVar18 = local_78;
          if (bVar9) goto LAB_004fd22b;
          uVar15 = Func::GetSourceContextId((Func *)&local_78->field_0);
          uVar16 = Func::GetLocalFunctionId((Func *)&paVar18->field_0);
          bVar9 = Js::Phases::IsEnabled
                            ((Phases *)&local_88->field_0,PolymorphicInlinePhase,uVar15,uVar16);
          if (bVar9) goto LAB_004fd22b;
          bVar9 = IsInliningOutSideLoops(this);
          if (bVar9) {
            uVar15 = Func::GetSourceContextId(this->topFunc);
            uVar16 = Func::GetLocalFunctionId(this->topFunc);
            bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlinePhase,uVar15,uVar16);
            paVar18 = local_78;
            if (!bVar9) {
              uVar15 = Func::GetSourceContextId((Func *)&local_78->field_0);
              uVar16 = Func::GetLocalFunctionId((Func *)&paVar18->field_0);
              bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlinePhase,uVar15,uVar16);
              if (!bVar9) goto LAB_004fd22b;
            }
          }
          uVar15 = Func::GetSourceContextId(this->topFunc);
          uVar16 = Func::GetLocalFunctionId(this->topFunc);
          this_04 = local_88;
          bVar9 = Js::Phases::IsEnabled
                            ((Phases *)&local_88->field_0,FixedMethodsPhase,uVar15,uVar16);
          if (bVar9) {
LAB_004fd85e:
            TryResetObjTypeSpecFldInfoOn((Inline *)&this_04->field_0,pPVar26);
            TryDisableRuntimePolymorphicCacheOn((Inline *)&this_04->field_0,pPVar26);
            paVar18 = local_80;
            local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                       InlinePolymorphicFunction
                                 (this,(Instr *)&paVar39->field_0,
                                  (FunctionJITTimeInfo *)&local_80->field_0,local_a8,PVar11,local_31
                                  ,recursiveInlineDepth,false);
          }
          else {
            uVar15 = Func::GetSourceContextId(this->topFunc);
            uVar16 = Func::GetLocalFunctionId(this->topFunc);
            this_04 = local_88;
            bVar9 = Js::Phases::IsEnabled
                              ((Phases *)&local_88->field_0,PolymorphicInlineFixedMethodsPhase,
                               uVar15,uVar16);
            paVar18 = local_80;
            if (bVar9) goto LAB_004fd85e;
            local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                       InlinePolymorphicFunctionUsingFixedMethods
                                 (this,(Instr *)&paVar39->field_0,
                                  (FunctionJITTimeInfo *)&local_80->field_0,local_a8,PVar11,pPVar26,
                                  local_31,recursiveInlineDepth);
          }
          bVar9 = true;
          isBuiltIn = false;
LAB_004fdd7d:
          uVar16 = this->inlineesProcessed + 1;
          this->inlineesProcessed = uVar16;
          this_03 = (char *)paVar18;
          uVar15 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)&paVar18->field_0);
          pLVar21 = pLStack_58;
          if ((uVar16 == uVar15) &&
             (bVar10 = FunctionJITTimeInfo::IsLdFldInlineePresent
                                 ((FunctionJITTimeInfo *)&paVar18->field_0), pLVar21 = pLStack_58,
             this_03 = (char *)paVar18, !bVar10 && local_69 == 0)) {
            return;
          }
          goto LAB_004fcce0;
        }
LAB_004fd22b:
        this_01 = (char16_t *)local_e0;
        bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
        paVar18 = local_80;
        if (bVar9) {
          pcVar40 = L"false";
          pcVar41 = L"false";
          if (isConstructorCall != false) {
            pcVar41 = L"true";
          }
          if ((anon_union_2_4_ea848c7b_for_ValueType_13 *)this->topFunc != local_78) {
            pcVar40 = L"true";
          }
          pJVar28 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)&local_80->field_0);
          pcVar29 = JITTimeFunctionBody::GetDisplayName(pJVar28);
          pcVar30 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)&paVar18->field_0,(wchar (*) [42])local_148);
          this_01 = 
          L"INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"
          ;
          Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"
                        ,pcVar41,pcVar40,pcVar29,pcVar30);
          Output::Flush();
        }
        TryResetObjTypeSpecFldInfoOn((Inline *)this_01,pPVar26);
        TryDisableRuntimePolymorphicCacheOn((Inline *)this_01,pPVar26);
        bVar9 = true;
      }
      isBuiltIn = false;
      pLVar21 = pLStack_58;
      this_03 = (char *)this_01;
    }
    else {
      if (TVar3 == (Int|Likely)) {
        uVar15 = this->inlineesProcessed;
        this_03 = (char *)local_80;
        uVar16 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)&local_80->field_0);
        if ((uVar15 != uVar16) && (*(char *)((long)paVar39 + 0x39) == '\x04')) {
          pPVar19 = IR::Instr::AsProfiledInstr((Instr *)&paVar39->field_0);
          PVar11 = (pPVar19->u).field_3.fldInfoData.f1;
          this_03 = (char *)Func::GetJITFunctionBody((Func *)&local_78->field_0);
          PVar12 = JITTimeFunctionBody::GetProfiledCallSiteCount((JITTimeFunctionBody *)this_03);
          if ((PVar11 < PVar12) &&
             (this_03 = (char *)local_80,
             pFVar20 = FunctionJITTimeInfo::GetInlinee
                                 ((FunctionJITTimeInfo *)&local_80->field_0,PVar11),
             pFVar20 != (FunctionJITTimeInfo *)0x0)) {
            this_03 = (char *)paVar39;
            bVar9 = Lowerer::IsSpreadCall((Instr *)&paVar39->field_0);
            if (bVar9) {
              this_03 = (char *)this;
              InlineSpread(this,(Instr *)&paVar39->field_0);
            }
            goto LAB_004fccdb;
          }
        }
        goto LAB_004fcbe5;
      }
      if (TVar3 != (IntCanBeUntagged|Object|CanBeTaggedValue|Likely)) {
        if (((TVar3 == (IntCanBeUntagged|Object|CanBeTaggedValue|Null|Undefined)) ||
            (TVar3 == (IntCanBeUntagged|Int|CanBeTaggedValue))) ||
           (TVar3 == (IntCanBeUntagged|Int|Object))) {
          this_03 = (char *)local_80;
          bVar9 = FunctionJITTimeInfo::IsLdFldInlineePresent
                            ((FunctionJITTimeInfo *)&local_80->field_0);
          if (((bVar9) && (*(char *)((long)paVar39 + 0x39) == '\x04')) &&
             (this_03 = (char *)paVar39,
             pPVar19 = IR::Instr::AsProfiledInstr((Instr *)&paVar39->field_0),
             ((ulong)(pPVar19->u).ldElemInfo & 0x80000) != 0)) {
            TVar3 = paVar39[0x18].bits;
            paVar18 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)
                       (paVar39 + (ulong)(TVar3 != (IntCanBeUntagged|Int|Object)) * 4 + 0x20);
            if (((paVar18 != (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) &&
                (this_03 = (char *)paVar18, bVar9 = IR::Opnd::IsSymOpnd((Opnd *)&paVar18->field_0),
                bVar9)) &&
               (pSVar33 = IR::Opnd::AsSymOpnd((Opnd *)&paVar18->field_0), this_03 = (char *)paVar18,
               pSVar33->m_sym->m_kind == SymKindProperty)) {
              pLStack_58 = pLVar21;
              this_00 = IR::Opnd::AsSymOpnd(&pSVar33->super_Opnd);
              bVar9 = IR::SymOpnd::IsPropertySymOpnd(this_00);
              if (!bVar9) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar35 = local_68;
                *local_68 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x83,"(symOpnd->AsSymOpnd()->IsPropertySymOpnd())",
                                   "symOpnd->AsSymOpnd()->IsPropertySymOpnd()");
                if (!bVar9) goto LAB_004fde7d;
                *puVar35 = 0;
              }
              pPVar26 = IR::Opnd::AsPropertySymOpnd(&pSVar33->super_Opnd);
              inlineCacheIndex = pPVar26->m_inlineCacheIndex;
              this_03 = (char *)local_80;
              paVar18 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        FunctionJITTimeInfo::GetLdFldInlinee
                                  ((FunctionJITTimeInfo *)&local_80->field_0,inlineCacheIndex);
              pLVar21 = pLStack_58;
              if ((paVar18 != (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) &&
                 (this_03 = (char *)paVar18,
                 pJVar28 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)&paVar18->field_0),
                 pLVar21 = pLStack_58, pJVar28 != (JITTimeFunctionBody *)0x0)) {
                uVar15 = FunctionJITTimeInfo::GetSourceContextId
                                   ((FunctionJITTimeInfo *)&paVar18->field_0);
                uVar16 = FunctionJITTimeInfo::GetLocalFunctionId
                                   ((FunctionJITTimeInfo *)&paVar18->field_0);
                this_03 = (char *)local_88;
                bVar9 = Js::Phases::IsEnabled
                                  ((Phases *)&local_88->field_0,InlineCandidatePhase,uVar15,uVar16);
                pLVar21 = pLStack_58;
                if (!bVar9) {
                  uVar15 = FunctionJITTimeInfo::GetSourceContextId
                                     ((FunctionJITTimeInfo *)&paVar18->field_0);
                  uVar16 = FunctionJITTimeInfo::GetLocalFunctionId
                                     ((FunctionJITTimeInfo *)&paVar18->field_0);
                  this_03 = (char *)local_88;
                  bVar9 = Js::Phases::IsEnabled
                                    ((Phases *)&local_88->field_0,InlineAccessorsPhase,uVar15,uVar16
                                    );
                  pLVar21 = pLStack_58;
                  if (!bVar9) {
                    uVar15 = FunctionJITTimeInfo::GetSourceContextId
                                       ((FunctionJITTimeInfo *)&paVar18->field_0);
                    uVar16 = FunctionJITTimeInfo::GetLocalFunctionId
                                       ((FunctionJITTimeInfo *)&paVar18->field_0);
                    if (TVar3 == (IntCanBeUntagged|Int|Object)) {
                      phase = InlineSettersPhase;
                    }
                    else {
                      phase = InlineGettersPhase;
                    }
                    this_03 = (char *)local_88;
                    bVar9 = Js::Phases::IsEnabled((Phases *)&local_88->field_0,phase,uVar15,uVar16);
                    pLVar21 = pLStack_58;
                    if (!bVar9) {
                      this_03 = (char *)this;
                      InlineGetterSetterFunction
                                (this,(Instr *)&paVar39->field_0,
                                 (FunctionJITTimeInfo *)&paVar18->field_0,local_a8,inlineCacheIndex,
                                 TVar3 != (IntCanBeUntagged|Int|Object),local_31,
                                 recursiveInlineDepth);
                      pLVar21 = pLStack_58;
                    }
                  }
                }
              }
            }
            goto LAB_004fcbe5;
          }
          goto LAB_004fccdb;
        }
        if (TVar3 == (IntIsLikelyUntagged|Int|Object|Null)) {
          if ((*(Opnd **)(paVar39 + 0x20) == (Opnd *)0x0) ||
             (bVar9 = IR::Opnd::IsRegOpnd(*(Opnd **)(paVar39 + 0x20)), !bVar9)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar35 = local_68;
            *local_68 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x210,"(instr->GetDst() && instr->GetDst()->IsRegOpnd())",
                               "instr->GetDst() && instr->GetDst()->IsRegOpnd()");
            if (!bVar9) goto LAB_004fde7d;
            *puVar35 = 0;
          }
          if (local_a8 != (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar35 = local_68;
            *local_68 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x211,"(symThis == nullptr)","symThis == nullptr");
            if (!bVar9) goto LAB_004fde7d;
            *puVar35 = 0;
          }
          this_03 = *(char **)(paVar39 + 0x20);
LAB_004fca4e:
          pRVar23 = IR::Opnd::AsRegOpnd((Opnd *)this_03);
          local_a8 = pRVar23->m_sym;
LAB_004fcbe5:
          isConstructorCall = false;
          bVar9 = false;
          isBuiltIn = false;
          goto LAB_004fcce0;
        }
        if (TVar3 != (IntIsLikelyUntagged|IntCanBeUntagged|Null)) {
          if (TVar3 != (IntIsLikelyUntagged|IntCanBeUntagged|Null|Undefined|Likely)) {
            if (TVar3 == (IntIsLikelyUntagged|IntCanBeUntagged|Int|Null)) {
              this_03 = (char *)local_78;
              bVar9 = Func::IsLoopBody((Func *)&local_78->field_0);
              if (!bVar9) {
                this->currentForInDepth = this->currentForInDepth + 1;
              }
            }
            else if (TVar3 == (IntIsLikelyUntagged|IntCanBeUntagged|Int|Null|Undefined)) {
              this_03 = (char *)local_78;
              bVar9 = Func::IsLoopBody((Func *)&local_78->field_0);
              if (!bVar9) {
                this_03 = (char *)paVar39;
                pBVar24 = IR::Instr::AsBranchInstr((Instr *)&paVar39->field_0);
                puVar1 = &pBVar24->m_branchTarget->field_0x78;
                *puVar1 = *puVar1 | 0x10;
              }
            }
            else if (TVar3 == (Float|IntCanBeUntagged|Int|Object|Null|Undefined)) {
              if (pLVar21 == (LabelInstr *)0x0) {
                pLVar21 = IR::Instr::AsLabelInstr((Instr *)&paVar39->field_0);
                if ((pLVar21->field_0x78 & 1) == 0) {
                  pLVar21 = (LabelInstr *)0x0;
                }
                else {
                  pLVar21 = IR::Instr::AsLabelInstr((Instr *)&paVar39->field_0);
                  if (pLVar21 == (LabelInstr *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar35 = local_68;
                    *local_68 = 1;
                    bVar9 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x42,"(loopTop)","loopTop");
                    if (!bVar9) goto LAB_004fde7d;
                    *puVar35 = 0;
                  }
                  this->isInLoop = this->isInLoop + 1;
                  local_bc = (pLVar21->labelRefs).
                             super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_RealCount.count;
                }
              }
              this_03 = (char *)paVar39;
              pLVar25 = IR::Instr::AsLabelInstr((Instr *)&paVar39->field_0);
              if ((pLVar25->field_0x78 & 0x10) != 0) {
                uVar15 = this->currentForInDepth;
                if (uVar15 == 0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar35 = local_68;
                  *local_68 = 1;
                  this_03 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                  ;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x49,"(this->currentForInDepth != 0)",
                                     "this->currentForInDepth != 0");
                  if (!bVar9) goto LAB_004fde7d;
                  *puVar35 = 0;
                  uVar15 = this->currentForInDepth;
                }
                this->currentForInDepth = uVar15 - 1;
              }
            }
            else {
              if (TVar3 == (Number|Int)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar35 = local_68;
                *local_68 = 1;
                this_03 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                ;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x58,"(false)","false");
                if (!bVar9) goto LAB_004fde7d;
                *puVar35 = 0;
                isBuiltIn = false;
                bVar9 = false;
                isConstructorCall = false;
                goto LAB_004fcce0;
              }
              if (TVar3 == (Float|IntIsLikelyUntagged|Int|Object|Undefined)) {
                uVar15 = this->inlineesProcessed;
                this_03 = (char *)local_80;
                pLStack_58 = pLVar21;
                uVar16 = FunctionJITTimeInfo::GetInlineeCount
                                   ((FunctionJITTimeInfo *)&local_80->field_0);
                pLVar21 = pLStack_58;
                isConstructorCall = false;
                this_01 = (char16_t *)this_03;
                if (uVar15 == uVar16) goto LAB_004fcfdb;
                if (*(char *)((long)paVar39 + 0x39) == '\x04') {
                  pPVar19 = IR::Instr::AsProfiledInstr((Instr *)&paVar39->field_0);
                  TVar4 = (pPVar19->u).field_3.fldInfoData;
                  this_03 = (char *)Func::GetJITFunctionBody((Func *)&local_78->field_0);
                  PVar11 = JITTimeFunctionBody::GetProfiledCallSiteCount
                                     ((JITTimeFunctionBody *)this_03);
                  if (((uint)TVar4 & 0xffff) < (uint)PVar11) {
                    PVar11 = TVar4.f1;
                    this_03 = (char *)local_80;
                    pFVar20 = FunctionJITTimeInfo::GetInlinee
                                        ((FunctionJITTimeInfo *)&local_80->field_0,PVar11);
                    if (pFVar20 != (FunctionJITTimeInfo *)0x0) {
                      uVar15 = FunctionJITTimeInfo::GetSourceContextId(pFVar20);
                      uVar16 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar20);
                      this_03 = (char *)local_88;
                      bVar9 = Js::Phases::IsEnabled
                                        ((Phases *)&local_88->field_0,InlineCandidatePhase,uVar15,
                                         uVar16);
                      if (!bVar9) {
                        this_03 = (char *)FunctionJITTimeInfo::GetBody(pFVar20);
                        bVar9 = JITTimeFunctionBody::HasProfileInfo((JITTimeFunctionBody *)this_03);
                        paVar18 = local_78;
                        if (bVar9) {
                          uVar15 = Func::GetSourceContextId((Func *)&local_78->field_0);
                          uVar16 = Func::GetLocalFunctionId((Func *)&paVar18->field_0);
                          bVar9 = Js::Phases::IsEnabled
                                            ((Phases *)&local_88->field_0,InlineRecursivePhase,
                                             uVar15,uVar16);
                          if (bVar9) {
                            constantArguments = 0;
                          }
                          else {
                            pSVar27 = IR::Opnd::GetStackSym(*(Opnd **)(paVar39 + 0x28));
                            pIVar22 = (pSVar27->field_5).m_instrDef;
                            if ((pSVar27->field_0x18 & pIVar22 != (Instr *)0x0) == 0) {
                              AssertCount = AssertCount + 1;
                              Js::Throw::LogAssert();
                              puVar35 = local_68;
                              *local_68 = 1;
                              bVar9 = Js::Throw::ReportAssert
                                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                                 ,0x1af,"(linkSym->IsSingleDef())",
                                                 "linkSym->IsSingleDef()");
                              if (!bVar9) goto LAB_004fde7d;
                              *puVar35 = 0;
                              pIVar22 = (pSVar27->field_5).m_instrDef;
                            }
                            uVar34 = 0;
                            puVar35 = local_68;
                            do {
                              constantArguments = (uint16)uVar34;
                              if ((pIVar22->m_src2 == (Opnd *)0x0) ||
                                 (bVar9 = IR::Opnd::IsSymOpnd(pIVar22->m_src2), !bVar9)) {
LAB_004fd4e1:
                                pIVar36 = (Instr *)0x0;
                              }
                              else {
                                pSVar33 = IR::Opnd::AsSymOpnd(pIVar22->m_src2);
                                pSVar27 = Sym::AsStackSym(pSVar33->m_sym);
                                bVar9 = StackSym::IsArgSlotSym(pSVar27);
                                if (!bVar9) {
                                  AssertCount = AssertCount + 1;
                                  Js::Throw::LogAssert();
                                  *puVar35 = 1;
                                  bVar9 = Js::Throw::ReportAssert
                                                    (
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                                  ,0x1b8,"(linkSym->IsArgSlotSym())",
                                                  "linkSym->IsArgSlotSym()");
                                  if (!bVar9) goto LAB_004fde7d;
                                  *puVar35 = 0;
                                }
                                if ((((pSVar27->field_0x18 & 1) == 0) ||
                                    ((pSVar27->field_5).m_instrDef == (Instr *)0x0)) &&
                                   ((bVar9 = Func::IsInPhase(*(Func **)(paVar39 + 0x10),FGPeepsPhase
                                                            ), !bVar9 &&
                                    (bVar9 = Func::IsInPhase(*(Func **)(paVar39 + 0x10),FGBuildPhase
                                                            ), !bVar9)))) {
                                  AssertCount = AssertCount + 1;
                                  Js::Throw::LogAssert();
                                  *puVar35 = 1;
                                  bVar9 = Js::Throw::ReportAssert
                                                    (
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                                  ,0x1bf,
                                                  "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                                                  ,
                                                  "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                                                  );
                                  if (!bVar9) goto LAB_004fde7d;
                                  *puVar35 = 0;
                                }
                                if ((pSVar27->field_0x18 & 1) == 0) goto LAB_004fd4e1;
                                pIVar36 = (pSVar27->field_5).m_instrDef;
                              }
                              if (pIVar22->m_opcode != ArgOut_A_InlineSpecialized) {
                                if (pIVar22->m_opcode == StartCall) {
                                  if (pIVar36 != (Instr *)0x0) {
                                    AssertCount = AssertCount + 1;
                                    Js::Throw::LogAssert();
                                    *puVar35 = 1;
                                    bVar9 = Js::Throw::ReportAssert
                                                      (
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                                  ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr"
                                                  );
                                    if (!bVar9) goto LAB_004fde7d;
                                    *puVar35 = 0;
                                  }
                                  break;
                                }
                                pOVar5 = pIVar22->m_src1;
                                bVar9 = IR::Opnd::IsRegOpnd(pOVar5);
                                puVar35 = local_68;
                                if (bVar9) {
                                  pRVar23 = IR::Opnd::AsRegOpnd(pOVar5);
                                  bVar9 = StackSym::IsIntConst(pRVar23->m_sym);
                                  puVar35 = local_68;
                                  if (((bVar9) && (pIVar22->m_src2 != (Opnd *)0x0)) &&
                                     (bVar9 = IR::Opnd::IsSymOpnd(pIVar22->m_src2), bVar9)) {
                                    pSVar33 = IR::Opnd::AsSymOpnd(pIVar22->m_dst);
                                    pSVar27 = Sym::AsStackSym(pSVar33->m_sym);
                                    if (((pSVar27->field_0x18 & 1) == 0) ||
                                       ((pSVar27->field_5).m_instrDef == (Instr *)0x0)) {
                                      AssertCount = AssertCount + 1;
                                      Js::Throw::LogAssert();
                                      puVar35 = local_68;
                                      *local_68 = 1;
                                      bVar9 = Js::Throw::ReportAssert
                                                        (
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                                  ,0x1cd,"(dstSym->IsSingleDef())",
                                                  "dstSym->IsSingleDef()");
                                      if (!bVar9) goto LAB_004fde7d;
                                      *puVar35 = 0;
                                    }
                                    bVar9 = StackSym::IsArgSlotSym(pSVar27);
                                    if (!bVar9) {
                                      AssertCount = AssertCount + 1;
                                      Js::Throw::LogAssert();
                                      puVar35 = local_68;
                                      *local_68 = 1;
                                      bVar9 = Js::Throw::ReportAssert
                                                        (
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                                  ,0x1ce,"(dstSym->IsArgSlotSym())",
                                                  "dstSym->IsArgSlotSym()");
                                      if (!bVar9) goto LAB_004fde7d;
                                      *puVar35 = 0;
                                    }
                                    AVar14 = StackSym::GetArgSlotNum(pSVar27);
                                    if ((short)(AVar14 - 1) == 0xd) break;
                                    uVar34 = uVar34 | 1 << (AVar14 - 1 & 0x1f);
                                    puVar35 = local_68;
                                  }
                                }
                              }
                              constantArguments = (uint16)uVar34;
                              pIVar22 = pIVar36;
                            } while (pIVar36 != (Instr *)0x0);
                          }
                          pFVar6 = this->topFunc;
                          this_03 = (char *)this->inliningHeuristics;
                          bVar9 = IsInliningOutSideLoops(this);
                          bVar9 = InliningHeuristics::BackendInlineIntoInliner
                                            ((InliningHeuristics *)this_03,pFVar20,
                                             (Func *)&local_78->field_0,pFVar6,PVar11,false,true,
                                             bVar9,this->isInLoop != 0,recursiveInlineDepth,
                                             constantArguments);
                          pLVar21 = pLStack_58;
                          if (bVar9) {
                            local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                       InlineScriptFunction
                                                 (this,(Instr *)&paVar39->field_0,pFVar20,local_a8,
                                                  PVar11,local_31,(Instr *)0x0,recursiveInlineDepth)
                            ;
                            uVar16 = this->inlineesProcessed + 1;
                            this->inlineesProcessed = uVar16;
                            this_03 = (char *)local_80;
                            uVar15 = FunctionJITTimeInfo::GetInlineeCount
                                               ((FunctionJITTimeInfo *)&local_80->field_0);
                            pLVar21 = pLStack_58;
                            if (uVar16 == uVar15) {
                              return;
                            }
                            goto LAB_004fccdb;
                          }
                        }
                      }
                      goto LAB_004fcbe5;
                    }
                  }
                }
              }
              else {
                if (TVar3 == (Number|CanBeTaggedValue|Null|Undefined)) {
                  if ((*(Opnd **)(paVar39 + 0x24) == (Opnd *)0x0) ||
                     (bVar9 = IR::Opnd::IsRegOpnd(*(Opnd **)(paVar39 + 0x24)), !bVar9)) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar35 = local_68;
                    *local_68 = 1;
                    bVar9 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x218,"(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd())",
                                       "instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd()");
                    if (!bVar9) goto LAB_004fde7d;
                    *puVar35 = 0;
                  }
                  if (local_a8 != (StackSym *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar35 = local_68;
                    *local_68 = 1;
                    bVar9 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x219,"(symThis == nullptr)","symThis == nullptr");
                    if (!bVar9) goto LAB_004fde7d;
                    *puVar35 = 0;
                  }
                  this_03 = *(char **)(paVar39 + 0x24);
                  goto LAB_004fca4e;
                }
                if (TVar3 != (Float|IntCanBeUntagged|Int|Object|CanBeTaggedValue|Likely)) {
                  if (pLVar21 != (LabelInstr *)0x0) {
                    if (((*(char *)((long)paVar39 + 0x39) != '\x02') ||
                        (this_03 = (char *)paVar39,
                        pBVar24 = IR::Instr::AsBranchInstr((Instr *)&paVar39->field_0),
                        pBVar24->m_branchTarget != pLVar21)) ||
                       (local_bc = local_bc - 1, local_bc != 0)) goto LAB_004fccdb;
                    uVar15 = this->isInLoop;
                    if (uVar15 == 0) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar35 = local_68;
                      *local_68 = 1;
                      this_03 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                      ;
                      bVar9 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                         ,0x22a,"(this->isInLoop > 0)","this->isInLoop > 0");
                      if (!bVar9) goto LAB_004fde7d;
                      *puVar35 = 0;
                      uVar15 = this->isInLoop;
                    }
                    this->isInLoop = uVar15 - 1;
                    local_bc = 0;
                  }
                  isConstructorCall = false;
                  bVar9 = false;
                  isBuiltIn = false;
                  pLVar21 = (LabelInstr *)0x0;
                  goto LAB_004fcce0;
                }
                this_03 = (char *)paVar39;
                pPVar17 = IR::Instr::AsPragmaInstr((Instr *)&paVar39->field_0);
                this->lastStatementBoundary = pPVar17;
              }
            }
            goto LAB_004fccdb;
          }
          isConstructorCall = true;
          isBuiltIn = true;
          goto LAB_004fcce0;
        }
        pLStack_58 = pLVar21;
        uVar15 = Func::GetSourceContextId(this->topFunc);
        uVar16 = Func::GetLocalFunctionId(this->topFunc);
        this_03 = (char *)local_88;
        bVar9 = Js::Phases::IsEnabled
                          ((Phases *)&local_88->field_0,InlineConstructorsPhase,uVar15,uVar16);
        isConstructorCall = true;
        this_01 = (char16_t *)this_03;
        if (!bVar9) goto LAB_004fc8da;
        goto LAB_004fcfdb;
      }
      this_03 = (char *)this;
      InlConstFoldArg(this,(Instr *)&paVar39->field_0,stack0xffffffffffffff10,callerArgOutCount);
LAB_004fccdb:
      isConstructorCall = false;
      isBuiltIn = false;
LAB_004fccdd:
      bVar9 = false;
    }
LAB_004fcce0:
  } while (local_31[0] != false);
  TVar3 = paVar39[0x18].bits;
  if (TVar3 != (Object|CanBeTaggedValue|Null|Undefined|Likely)) {
    if ((TVar3 != (IntIsLikelyUntagged|IntCanBeUntagged|Null|Undefined|Likely)) &&
       (TVar3 != (IntIsLikelyUntagged|IntCanBeUntagged|Null))) goto LAB_004fc2be;
    isConstructorCall = true;
  }
  pLStack_58 = pLVar21;
  pPVar26 = GetMethodLdOpndForCallInstr((Inline *)this_03,(Instr *)&paVar39->field_0);
  TryResetObjTypeSpecFldInfoOn((Inline *)this_03,pPVar26);
  TryDisableRuntimePolymorphicCacheOn((Inline *)this_03,pPVar26);
  pSVar27 = IR::Opnd::GetStackSym(*(Opnd **)(paVar39 + 0x24));
  bVar2 = *(byte *)(*(long *)(paVar39 + 0x24) + 0xb);
  local_5a.bits =
       local_5a.bits &
       ~(IntIsLikelyUntagged|IntCanBeUntagged|Int|Object|CanBeTaggedValue|Null|Undefined|Likely);
  this_03 = (char *)this;
  bVar9 = TryOptimizeCallInstrWithFixedMethod
                    (this,(Instr *)&paVar39->field_0,(FunctionJITTimeInfo *)0x0,bVar9,isBuiltIn,
                     isConstructorCall,false,(bool *)&local_5a,false,0);
  pLVar21 = pLStack_58;
  if (bVar9) {
    if (pSVar27 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar35 = local_68;
      *local_68 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x249,"(originalCallTargetStackSym != nullptr)",
                         "originalCallTargetStackSym != nullptr");
      if (!bVar9) {
LAB_004fde7d:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar35 = 0;
    }
    this_02 = IR::ByteCodeUsesInstr::New((Instr *)&paVar39->field_0);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              (this_02,(bool)((bVar2 & 8) >> 3),(pSVar27->super_Sym).m_id);
    this_03 = (char *)paVar39;
    IR::Instr::InsertBefore((Instr *)&paVar39->field_0,&this_02->super_Instr);
    pLVar21 = pLStack_58;
    if (paVar39[0x18].bits == (IntIsLikelyUntagged|IntCanBeUntagged|Null)) {
      uVar15 = Func::GetSourceContextId(this->topFunc);
      pLVar21 = pLStack_58;
      uVar16 = Func::GetLocalFunctionId(this->topFunc);
      this_03 = (char *)local_88;
      bVar9 = Js::Phases::IsEnabled
                        ((Phases *)&local_88->field_0,SplitNewScObjectPhase,uVar15,uVar16);
      if (!bVar9) {
        this_03 = (char *)this;
        SplitConstructorCall(this,(Instr *)&paVar39->field_0,false,true,(Instr **)0x0,(Instr **)0x0)
        ;
      }
    }
  }
  else if ((paVar39[0x18].bits == (IntIsLikelyUntagged|IntCanBeUntagged|Null|Undefined|Likely)) &&
          (*(long *)(paVar39 + 0x20) != 0)) {
    local_148[0] = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(*(long *)(paVar39 + 0x20) + 8);
    this_03 = (char *)local_148;
    bVar9 = ValueType::IsLikelyNativeArray((ValueType *)this_03);
    if (bVar9) {
      IR::Instr::ConvertToBailOutInstr
                ((Instr *)&paVar39->field_0,(Instr *)paVar39,BailOutOnNotNativeArray,0xffffffff);
      this_03 = (char *)paVar39;
    }
  }
  goto LAB_004fc2be;
}

Assistant:

void
Inline::Optimize(Func *func, __in_ecount_opt(callerArgOutCount) IR::Instr *callerArgOuts[], Js::ArgSlot callerArgOutCount, uint recursiveInlineDepth)
{
    if (!func->DoInline() || !topFunc->DoInline())
    {
        return;
    }

    bool doFixedMethods = !PHASE_OFF(Js::FixedMethodsPhase, func);
    const FunctionJITTimeInfo * inlinerData = func->GetWorkItem()->GetJITTimeInfo();

    bool doInline = (inlinerData->GetInlineeCount() > 0 || inlinerData->IsLdFldInlineePresent());
    if (PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::InlinePhase, func) ||
        func->IsJitInDebugMode())
    {
        doInline = false;
    }

    func->actualCount = callerArgOutCount;

    // Current for..in depth starts with the inlinee's base depth
    this->currentForInDepth = func->m_forInLoopBaseDepth;

    // Keep the caller's "this" symbol (if any).
    StackSym *symThis = nullptr;
    lastStatementBoundary = nullptr;
    IR::LabelInstr* loopTop = nullptr;
    int32 backEdgeCount = 0;

    // Profile data already filter call site outside of loops if the function has loops, so we don't need to detect that here.
    FOREACH_INSTR_EDITING(instr, instrNext, func->m_headInstr)
    {
        bool isInlined = false;
        bool isPolymorphic = false;
        bool isBuiltIn = false;
        bool isCtor = false;
        if (doInline)
        {
            switch (instr->m_opcode)
            {
            case Js::OpCode::StatementBoundary:
                lastStatementBoundary = instr->AsPragmaInstr();
                break;

            case Js::OpCode::Label:
                {
                    if (!loopTop && instr->AsLabelInstr()->m_isLoopTop)
                    {
                        // We only need to know if we are inside loop or not, it doesn't matter how many nested levels we are in.
                        // This is the cheap way of doing so.
                        loopTop = instr->AsLabelInstr();
                        AnalysisAssert(loopTop);
                        this->isInLoop++;
                        backEdgeCount = loopTop->labelRefs.Count();
                    }

                    if (instr->AsLabelInstr()->m_isForInExit)
                    {
                        AssertOrFailFast(this->currentForInDepth != 0);
                        this->currentForInDepth--;
                    }
                }
                break;
            case Js::OpCode::InitForInEnumerator:
                // Loop body uses the for in enumerator in the interpreter frame.
                // No need to keep track of its depth
                if (!func->IsLoopBody())
                {
                    this->currentForInDepth++;
                }
                break;
            case Js::OpCode::BrOnNotEmpty:
                // Byte code doesn't emit BrOnNotEmpty, and we have done any transformation yet.
                Assert(false);
                break;
            case Js::OpCode::BrOnEmpty:
                // Loop body uses the for in enumerator in the interpreter frame.
                // No need to keep track of its depth
                if (!func->IsLoopBody())
                {
                    instr->AsBranchInstr()->GetTarget()->m_isForInExit = true;
                }
                break;
            case Js::OpCode::StFld:
            case Js::OpCode::LdFld:
            case Js::OpCode::LdFldForCallApplyTarget:
                {
                    // Try inlining of getter setter
                    if (!inlinerData->IsLdFldInlineePresent())
                    {
                        break;
                    }

                    if (!instr->IsProfiledInstr())
                    {
                        break;
                    }

                    if (!(instr->AsProfiledInstr()->u.FldInfo().flags & Js::FldInfoFlags::FldInfo_FromAccessor))
                    {
                        break;
                    }

                    bool getter = instr->m_opcode != Js::OpCode::StFld;

                    IR::Opnd *opnd = getter ? instr->GetSrc1() : instr->GetDst();
                    if (!(opnd && opnd->IsSymOpnd()))
                    {
                        break;
                    }

                    IR::SymOpnd* symOpnd = opnd->AsSymOpnd();
                    if (!symOpnd->m_sym->IsPropertySym())
                    {
                        break;
                    }
                    Assert(symOpnd->AsSymOpnd()->IsPropertySymOpnd());

                    const auto inlineCacheIndex = symOpnd->AsPropertySymOpnd()->m_inlineCacheIndex;
                    const FunctionJITTimeInfo * inlineeData = inlinerData->GetLdFldInlinee(inlineCacheIndex);
                    if (!inlineeData)
                    {
                        break;
                    }

                    JITTimeFunctionBody * body = inlineeData->GetBody();
                    if (!body)
                    {
                        break;
                    }

                    bool isInlinePhaseOff = PHASE_OFF(Js::InlineCandidatePhase, inlineeData) ||
                                            PHASE_OFF(Js::InlineAccessorsPhase, inlineeData) ||
                                            (getter && PHASE_OFF(Js::InlineGettersPhase, inlineeData)) ||
                                            (!getter && PHASE_OFF(Js::InlineSettersPhase, inlineeData));

                    if (isInlinePhaseOff)
                    {
                        break;
                    }

                    this->InlineGetterSetterFunction(instr, inlineeData, symThis, inlineCacheIndex, getter /*isGetter*/, &isInlined, recursiveInlineDepth);

                    break;
                }

            case Js::OpCode::NewScObjArray:
                // We know we're not going to inline these. Just break out and try to do a fixed function check.
                isCtor = true;
                isBuiltIn = true;
                break;

            case Js::OpCode::NewScObject:
                isCtor = true;
                if (PHASE_OFF(Js::InlineConstructorsPhase, this->topFunc))
                {
                    break;
                }
                // fall-through

            case Js::OpCode::CallI:
                {

                    IR::PropertySymOpnd* methodValueOpnd = GetMethodLdOpndForCallInstr(instr);

                    if (this->inlineesProcessed == inlinerData->GetInlineeCount())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    if(!instr->IsProfiledInstr())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                    if(profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    const FunctionJITTimeInfo * inlineeData = inlinerData->GetInlinee(profileId);
                    IR::Instr * callbackDefInstr = nullptr;
                    if (inlineeData == nullptr)
                    {
                        if (PHASE_ENABLED(InlineCallbacksPhase, func))
                        {
                            callbackDefInstr = TryGetCallbackDefInstrForCallInstr(instr);
                        }

                        if (callbackDefInstr == nullptr)
                        {
                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            break;
                        }
                    }

                    if (inlineeData != nullptr && inlinerData->IsPolymorphicCallSite(profileId))
                    {
                        if (PHASE_ENABLED(InlineCallbacksPhase, func))
                        {
                            callbackDefInstr = TryGetCallbackDefInstrForCallInstr(instr);
                            if (callbackDefInstr == nullptr)
                            {
                                isPolymorphic = true;
                            }
                        }
                        else
                        {
                            isPolymorphic = true;
                        }
                    }

                    if (callbackDefInstr != nullptr)
                    {
                        Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callbackDefInstr->AsProfiledInstr()->u.profileId);
                        inlineeData = callbackDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallbackInlinee(callSiteId);

#if ENABLE_DEBUG_CONFIG_OPTIONS
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        INLINE_CALLBACKS_TRACE(_u("INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n"),
                            callSiteId, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
#endif
                    }

                    if (isPolymorphic)
                    {
                        if (isCtor ||
                            (PHASE_OFF(Js::PolymorphicInlinePhase, this->topFunc) || PHASE_OFF(Js::PolymorphicInlinePhase, func)) ||
                            (this->IsInliningOutSideLoops() && !PHASE_FORCE(Js::InlinePhase, this->topFunc) && !PHASE_FORCE(Js::InlinePhase, func)))
                        {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"),
                                     (isCtor? _u("true"): _u("false")), (this->topFunc != func? _u("true"):_u("false")),
                                     inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));

                            // TODO: Constructor polymorphic inlining

                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            break;
                        }
                        if (!PHASE_OFF(Js::FixedMethodsPhase, this->topFunc) && !PHASE_OFF(Js::PolymorphicInlineFixedMethodsPhase, this->topFunc))
                        {
                            instrNext = InlinePolymorphicFunctionUsingFixedMethods(instr, inlinerData, symThis, profileId, methodValueOpnd, &isInlined, recursiveInlineDepth);
                        }
                        else
                        {
                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            instrNext = InlinePolymorphicFunction(instr, inlinerData, symThis, profileId, &isInlined, recursiveInlineDepth);
                        }
                    }
                    else
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        Js::OpCode builtInInlineCandidateOpCode;
                        ValueType builtInReturnType;

                        // If the inlinee info is the array constructor, just change the opcode to NewScObjArray
                        // so that we will inline the array allocation in lower
                        if (isCtor && inlineeData->GetFunctionInfoAddr() == this->topFunc->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr())
                        {
                            isBuiltIn = true;
                            instr->m_opcode = Js::OpCode::NewScObjArray;
                            instr->AsProfiledInstr()->u.profileId = Js::Constants::NoProfileId;
                            break;
                        }

                        isBuiltIn = InliningDecider::GetBuiltInInfo(inlineeData, &builtInInlineCandidateOpCode, &builtInReturnType);

                        if(!builtInReturnType.IsUninitialized() && instr->GetDst())
                        {
                            Assert(!inlineeData->HasBody());
                            AssertMsg(instr->m_opcode != Js::OpCode::NewScObjArray, "We should have broken out of the switch statement earlier on this opcode.");
                            // Value types for the array built-in calls are pulled from the profile; don't change them here.
                            if ((instr->m_opcode != Js::OpCode::NewScObjArray) ||
                                !instr->GetDst()->GetValueType().IsLikelyNativeArray())
                            {
                                // Assume that this built-in function is not going to be inlined, so the return type cannot be definite
                                instr->GetDst()->SetValueType(builtInReturnType.ToLikely());
                            }
                        }

                        bool isInlinePhaseOff = inlineeData->HasBody() ?
                            PHASE_OFF(Js::InlineCandidatePhase, inlineeData) :
                            PHASE_OFF1(Js::InlineBuiltInPhase);
                        if (isInlinePhaseOff)
                        {
                            break;
                        }

                        if(!inlineeData->HasBody() && builtInInlineCandidateOpCode == 0)
                        {
                            // This built-in function is not going to be inlined
                            break;
                        }

                        bool hasDstUsedBuiltInReturnType = false;
                        if(!inlineeData->HasBody())
                        {
                            Assert(builtInInlineCandidateOpCode != 0);
                            if(isCtor)
                            {
                                // Inlining a built-in function called as a constructor is currently not supported. Although InliningDecider
                                // already checks for this, profile data matching with a function does not take into account the difference
                                // between a constructor call and a regular function call, so need to check it again.
                                break;
                            }

                            // This built-in function should be inlined, so reset the destination's value type
                            if(!builtInReturnType.IsUninitialized())
                            {
                                if(instr->GetDst())
                                {
                                    hasDstUsedBuiltInReturnType = true;
                                    instr->GetDst()->SetValueType(builtInReturnType);
                                    if(builtInReturnType.IsDefinite())
                                    {
                                        instr->GetDst()->SetValueTypeFixed();
                                    }
                                }
                            }
                        }
                        else
                        {

                            if (!inlineeData->GetBody()->HasProfileInfo())        // Don't try to inline a function if it doesn't have profile data
                            {
                                break;
                            }

                            uint16 constantArguments = 0;
                            if (!PHASE_OFF(Js::InlineRecursivePhase, func))
                            {
                                instr->IterateArgInstrs([&](IR::Instr* argInstr) {
                                    IR::Opnd *src1 = argInstr->GetSrc1();
                                    if (!src1->IsRegOpnd())
                                    {
                                        return false;
                                    }
                                    StackSym *sym = src1->AsRegOpnd()->m_sym;
                                    if (sym->IsIntConst())
                                    {
                                        if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
                                        {
                                            StackSym *dstSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
                                            Assert(dstSym->IsSingleDef());
                                            Assert(dstSym->IsArgSlotSym());
                                            Js::ArgSlot argCount = dstSym->GetArgSlotNum() - 1;

                                            if (argCount == Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                                            {
                                                return true;
                                            }
                                            constantArguments |= (1 << argCount);
                                        }
                                    }
                                    return false;
                                });
                            }

                            if (!inliningHeuristics.BackendInlineIntoInliner(inlineeData,
                                func, this->topFunc, profileId, isCtor, true /*isFixedMethodCall*/,
                                this->IsInliningOutSideLoops(), this->isInLoop != 0, recursiveInlineDepth, constantArguments))
                            {
                                break;
                            }

                        }


                        instrNext = builtInInlineCandidateOpCode != 0 ?
                            this->InlineBuiltInFunction(instr, inlineeData, builtInInlineCandidateOpCode, inlinerData, symThis, &isInlined, profileId, recursiveInlineDepth, instr) :
                            this->InlineScriptFunction(instr, inlineeData, symThis, profileId, &isInlined, callbackDefInstr, recursiveInlineDepth);
                        if (!isInlined && hasDstUsedBuiltInReturnType)
                        {
                            // We haven't actually inlined the builtin, we need to revert the value type to likely
                            instr->GetDst()->UnsetValueTypeFixed();
                            instr->GetDst()->SetValueType(instr->GetDst()->GetValueType().ToLikely());
                        }
                    }
                    if(++this->inlineesProcessed == inlinerData->GetInlineeCount())
                    {
                        // getterSetter inline caches are shared and we have no way of knowing how many more are present
                        if (!inlinerData->IsLdFldInlineePresent() && !doFixedMethods)
                        {
                            return ;
                        }
                    }
                    break;
                }
            case Js::OpCode::AsmJsCallI:
            {
                if (this->inlineesProcessed == inlinerData->GetInlineeCount() || !instr->IsProfiledInstr())
                {
                    break;
                }

                const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                if (profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                {
                    break;
                }

                const auto inlineeData = inlinerData->GetInlinee(profileId);
                if (!inlineeData)
                {
                    break;
                }
                if (PHASE_OFF(Js::InlineCandidatePhase, inlineeData))
                {
                    break;
                }

                // Don't try to inline a function if it doesn't have profile data
                if (!inlineeData->GetBody()->HasProfileInfo())
                {
                    break;
                }

                uint16 constantArguments = 0;
                if (!PHASE_OFF(Js::InlineRecursivePhase, func))
                {
                    instr->IterateArgInstrs([&](IR::Instr* argInstr) {
                        IR::Opnd *src1 = argInstr->GetSrc1();
                        if (!src1->IsRegOpnd())
                        {
                            return false;
                        }
                        StackSym *sym = src1->AsRegOpnd()->m_sym;
                        if (sym->IsIntConst())
                        {
                            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
                            {
                                StackSym *dstSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
                                Assert(dstSym->IsSingleDef());
                                Assert(dstSym->IsArgSlotSym());
                                Js::ArgSlot argCount = dstSym->GetArgSlotNum() - 1;

                                if (argCount == Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                                {
                                    return true;
                                }
                                constantArguments |= (1 << argCount);
                            }
                        }
                        return false;
                    });
                }

                if (!inliningHeuristics.BackendInlineIntoInliner(
                    inlineeData, func, this->topFunc, profileId, isCtor, true /*isFixedMethodCall*/,
                    this->IsInliningOutSideLoops(), this->isInLoop != 0, recursiveInlineDepth, constantArguments))
                {
                    break;
                }

                instrNext = this->InlineScriptFunction(instr, inlineeData, symThis, profileId, &isInlined, nullptr, recursiveInlineDepth);

                if (++this->inlineesProcessed == inlinerData->GetInlineeCount())
                {
                    return;
                }

                break;
            }
            case Js::OpCode::CallIExtended:
            {
                if (this->inlineesProcessed == inlinerData->GetInlineeCount())
                {
                    break;
                }

                if (!instr->IsProfiledInstr())
                {
                    break;
                }

                const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                if (profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                {
                    break;
                }

                const auto inlineeData = inlinerData->GetInlinee(profileId);
                if (!inlineeData)
                {
                    break;
                }

                if (Lowerer::IsSpreadCall(instr))
                {
                    InlineSpread(instr);
                }
                break;
            }

            case Js::OpCode::ArgOut_A:
                InlConstFoldArg(instr, callerArgOuts, callerArgOutCount);
                break;

            case Js::OpCode::LdThis:
                Assert(instr->GetDst() && instr->GetDst()->IsRegOpnd());
                Assert(symThis == nullptr);

                symThis = instr->GetDst()->AsRegOpnd()->m_sym;
                break;

            case Js::OpCode::CheckThis:
                // Is this possible? Can we be walking an inlinee here? Doesn't hurt to support this case...
                Assert(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd());
                Assert(symThis == nullptr);

                symThis = instr->GetSrc1()->AsRegOpnd()->m_sym;
                break;

            default:
                {
                    if (loopTop && instr->IsBranchInstr())
                    {
                        // Look for the back edge to loopTop.
                        IR::BranchInstr *branch = instr->AsBranchInstr();
                        IR::LabelInstr *labelDestination = branch->GetTarget();
                        if (labelDestination == loopTop) // We found the back edge
                        {
                            backEdgeCount--;
                            if (backEdgeCount == 0) // We have seen all the back edges, hence we are outside loop now.
                            {
                                Assert(this->isInLoop > 0);
                                --this->isInLoop;
                                loopTop = nullptr;
                            }
                        }
                    }
                }

            }
        }

        // If we chose not to inline, let's try to optimize this call if it uses a fixed method
        if (!isInlined)
        {
            switch (instr->m_opcode)
            {
            case Js::OpCode::NewScObject:
            case Js::OpCode::NewScObjArray:
                isCtor = true;
                // intentionally fall through.
            case Js::OpCode::CallI:
                {
                    IR::PropertySymOpnd* methodValueOpnd = GetMethodLdOpndForCallInstr(instr);

                    TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                    TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                    StackSym* originalCallTargetStackSym = instr->GetSrc1()->GetStackSym();
                    bool originalCallTargetOpndIsJITOpt = instr->GetSrc1()->GetIsJITOptimizedReg();
                    bool safeThis = false;
                    if (TryOptimizeCallInstrWithFixedMethod(instr, nullptr, isPolymorphic /*isPolymorphic*/, isBuiltIn /*isBuiltIn*/, isCtor /*isCtor*/, false /*isInlined*/, safeThis /*unused here*/))
                    {
                        Assert(originalCallTargetStackSym != nullptr);

                        // Insert a ByteCodeUsesInstr to make sure the methodValueDstOpnd's constant value is captured by any
                        // bailout that occurs between CheckFixedMethodField and CallI.
                        IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(instr);
                        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);
                        instr->InsertBefore(useCallTargetInstr);

                        // Split NewScObject into NewScObjectNoCtor and CallI, but don't touch NewScObjectArray.
                        if (instr->m_opcode == Js::OpCode::NewScObject && !PHASE_OFF(Js::SplitNewScObjectPhase, this->topFunc))
                        {
                            SplitConstructorCall(instr, false, true);
                        }
                    }
                    else if (instr->m_opcode == Js::OpCode::NewScObjArray)
                    {
                        if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeArray())
                        {
                            // We expect to create a native array here, so we'll insert a check against the
                            // expected call target, which requires a bailout.
                            instr = instr->ConvertToBailOutInstr(instr, IR::BailOutOnNotNativeArray);
                        }
                    }
                }
                break;
            }
        }
    } NEXT_INSTR_EDITING;

    INLINE_FLUSH();
}